

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  LogEst a;
  LogEst a_00;
  int iVar2;
  WhereClause *pWVar3;
  WhereLoop *pTemplate;
  SrcList *pSVar4;
  WhereOrInfo *pWVar5;
  ulong uVar6;
  u16 uVar7;
  LogEst rRun;
  LogEst nOut;
  ulong uVar8;
  WhereTerm *pWVar9;
  ulong uVar10;
  WhereTerm *pWVar11;
  ulong uVar12;
  LogEst *pLVar13;
  WhereTerm *pWVar14;
  WhereTerm *pWVar15;
  ulong uVar16;
  bool bVar17;
  WhereOrSet sSum;
  WhereOrSet sCur;
  WhereClause tempWC;
  int local_36c;
  WhereOrSet local_2f8;
  WhereLoopBuilder local_2b8;
  WhereOrSet local_288;
  ulong local_248;
  LogEst aLStack_240 [20];
  WhereInfo *local_218;
  WhereClause *local_210;
  undefined1 local_208;
  undefined4 local_204;
  undefined4 local_1fc;
  WhereTerm *local_1f8;
  
  pWVar3 = pBuilder->pWC;
  pTemplate = pBuilder->pNew;
  pWVar15 = pWVar3->a;
  local_2f8.a[1].rRun = 0;
  local_2f8.a[1].nOut = 0;
  local_2f8.a[1]._12_4_ = 0;
  local_2f8.a[2].prereq = 0;
  local_2f8.a[0].rRun = 0;
  local_2f8.a[0].nOut = 0;
  local_2f8.a[0]._12_4_ = 0;
  local_2f8.a[1].prereq = 0;
  local_2f8._0_8_ = 0;
  local_2f8.a[0].prereq = 0;
  local_2f8.a[2].rRun = 0;
  local_2f8.a[2].nOut = 0;
  local_2f8.a[2]._12_4_ = 0;
  pSVar4 = pBuilder->pWInfo->pTabList;
  bVar1 = pTemplate->iTab;
  local_36c = 0;
  if (0 < pWVar3->nTerm && (pSVar4->a[bVar1].fg.jointype & 0x10) == 0) {
    pWVar14 = pWVar15 + pWVar3->nTerm;
    iVar2 = pSVar4->a[bVar1].iCursor;
    uVar12 = 0;
    do {
      if ((pWVar15->eOperator & 0x200) == 0) {
        local_36c = 0;
      }
      else {
        pWVar5 = (pWVar15->u).pOrInfo;
        if ((pWVar5->indexable & pTemplate->maskSelf) == 0) {
          local_36c = 0;
        }
        else {
          pWVar11 = (pWVar5->wc).a + (pWVar5->wc).nTerm;
          local_2b8.pNew = pBuilder->pNew;
          local_2b8.bldFlags1 = pBuilder->bldFlags1;
          local_2b8.bldFlags2 = pBuilder->bldFlags2;
          local_2b8._34_2_ = *(undefined2 *)&pBuilder->field_0x22;
          local_2b8.iPlanLimit = pBuilder->iPlanLimit;
          local_2b8.pWInfo._0_4_ = *(undefined4 *)&pBuilder->pWInfo;
          local_2b8.pWInfo._4_4_ = *(undefined4 *)((long)&pBuilder->pWInfo + 4);
          local_2b8.pWC = pBuilder->pWC;
          local_2b8.pOrSet = &local_288;
          pWVar9 = (pWVar5->wc).a;
          local_36c = 0;
          if (pWVar9 < pWVar11) {
            local_36c = 0;
            bVar17 = true;
            do {
              if ((pWVar9->eOperator & 0x400) == 0) {
                if (pWVar9->leftCursor == iVar2) {
                  local_218 = pWVar3->pWInfo;
                  local_208 = 0x2c;
                  local_204 = 1;
                  local_1fc = 1;
                  local_2b8.pWC = (WhereClause *)&local_218;
                  local_210 = pWVar3;
                  local_1f8 = pWVar9;
                  goto LAB_001a553f;
                }
              }
              else {
                local_2b8.pWC = *(WhereClause **)&pWVar9->u;
LAB_001a553f:
                local_288.n = 0;
                if ((pSVar4->a[bVar1].pTab)->eTabType == '\x01') {
                  local_36c = whereLoopAddVirtual(&local_2b8,mPrereq,mUnusable);
                }
                else {
                  local_36c = whereLoopAddBtree(&local_2b8,mPrereq);
                }
                if (local_36c == 0) {
                  local_36c = whereLoopAddOr(&local_2b8,mPrereq,mUnusable);
                }
                if (local_288.n == 0) {
                  local_2f8._0_8_ = (ulong)(uint6)local_2f8._2_6_ << 0x10;
                  uVar12 = 0;
                  goto LAB_001a5711;
                }
                if (bVar17) {
                  local_2f8.n = local_288.n;
                  memcpy(local_2f8.a,local_288.a,(ulong)local_288.n << 4);
                }
                else {
                  uVar7 = local_2f8.n;
                  uVar12 = local_2f8._0_8_ & 0xffff;
                  memcpy(&local_248,local_2f8.a,(local_2f8._0_8_ & 0xffff) << 4);
                  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffff0000;
                  if (uVar7 != 0) {
                    uVar8 = 1;
                    uVar10 = 0;
                    do {
                      if ((short)uVar8 == 0) {
                        uVar8 = 0;
                      }
                      else {
                        uVar6 = (&local_248)[uVar10 * 2];
                        a = aLStack_240[uVar10 * 8];
                        a_00 = aLStack_240[uVar10 * 8 + 1];
                        pLVar13 = &local_288.a[0].nOut;
                        uVar16 = 0;
                        do {
                          uVar8 = ((WhereOrCost *)(pLVar13 + -5))->prereq;
                          rRun = sqlite3LogEstAdd(a,pLVar13[-1]);
                          nOut = sqlite3LogEstAdd(a_00,*pLVar13);
                          whereOrInsert(&local_2f8,uVar8 | uVar6,rRun,nOut);
                          uVar16 = uVar16 + 1;
                          uVar8 = (ulong)local_288.n;
                          pLVar13 = pLVar13 + 8;
                        } while (uVar16 < uVar8);
                      }
                      uVar10 = uVar10 + 1;
                    } while (uVar10 != uVar12);
                  }
                }
                bVar17 = false;
              }
              pWVar9 = pWVar9 + 1;
            } while (pWVar9 < pWVar11);
            uVar12 = local_2f8._0_8_ & 0xffff;
          }
LAB_001a5711:
          pTemplate->nLTerm = 1;
          *pTemplate->aLTerm = pWVar15;
          pTemplate->wsFlags = 0x2000;
          pTemplate->rSetup = 0;
          pTemplate->iSortIdx = '\0';
          *(undefined8 *)&pTemplate->u = 0;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          *(undefined8 *)((long)&pTemplate->u + 0x10) = 0;
          if ((short)uVar12 != 0 && local_36c == 0) {
            pLVar13 = &local_2f8.a[0].nOut;
            uVar8 = 1;
            do {
              pTemplate->rRun = (short)*(undefined4 *)(pLVar13 + -1) + 1;
              pTemplate->nOut = *pLVar13;
              pTemplate->prereq = ((WhereOrCost *)(pLVar13 + -5))->prereq;
              local_36c = whereLoopInsert(pBuilder,pTemplate);
              if (local_36c != 0) break;
              pLVar13 = pLVar13 + 8;
              bVar17 = uVar8 < uVar12;
              uVar8 = uVar8 + 1;
            } while (bVar17);
          }
        }
      }
    } while ((local_36c == 0) && (pWVar15 = pWVar15 + 1, pWVar15 < pWVar14));
  }
  return local_36c;
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  SrcItem *pItem;

  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  /* The multi-index OR optimization does not work for RIGHT and FULL JOIN */
  if( pItem->fg.jointype & JT_RIGHT ) return SQLITE_OK;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;

      sSubBuild = *pBuilder;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.nBase = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n",
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || rc==SQLITE_DONE || sCur.n==0
                || rc==SQLITE_NOMEM );
        testcase( rc==SQLITE_NOMEM && sCur.n>0 );
        testcase( rc==SQLITE_DONE );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty
        ** (equivalent to multiplying the cost by 1.07) to ensure that
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}